

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastpackwithoutmask19_32(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint32_t uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint uVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  
  uVar1 = in[1];
  uVar2 = in[2];
  uVar3 = in[3];
  uVar4 = in[4];
  vpmovsxbd_avx512f(_DAT_001944c0);
  vpmovsxbd_avx2(ZEXT816(0x60584c443830241c));
  auVar12 = vpmovsxbd_avx512f(_DAT_001944d0);
  uVar9 = uVar3 >> 7;
  *out = uVar1 << 0x13 | *in;
  out[1] = uVar3 << 0x19 | uVar2 << 6 | uVar1 >> 0xd;
  uVar1 = in[5];
  out[2] = uVar1 << 0x1f | uVar4 << 0xc | uVar9;
  auVar13 = vpgatherdd_avx512f(*(undefined4 *)((long)in + (ulong)uVar9));
  auVar6 = vpmovsxbd_avx2(ZEXT816(0xa09070604030100));
  auVar10 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)uVar1));
  auVar10 = vpsllvd_avx2(auVar10,_DAT_0018f7a0);
  auVar5 = vpinsrd_avx(ZEXT416(in[0x1b]),in[0x1d],1);
  auVar11 = vextracti64x4_avx512f(auVar13,1);
  auVar7 = vpsllvd_avx2(auVar5,_DAT_001923b0);
  auVar14 = valignd_avx512f(auVar13,auVar13,0xf);
  auVar8 = vpsrlvd_avx2(auVar11._16_16_,_DAT_001903d0);
  auVar15 = vpermd_avx512f(ZEXT3264(auVar6),auVar13);
  auVar6 = vpsrlvd_avx2(auVar15._0_32_,_DAT_0018f7e0);
  auVar5 = vpinsrd_avx(auVar14._0_16_,uVar1,0);
  auVar14 = vinserti32x4_avx512f(auVar14,auVar5,0);
  auVar15 = vpermt2d_avx512f(ZEXT3264(auVar10),auVar12,ZEXT1664(auVar7));
  auVar13 = vpsllvd_avx512f(auVar13,_DAT_001a06c0);
  auVar12 = vpermt2d_avx512f(ZEXT3264(auVar6),auVar12,ZEXT1664(auVar8));
  auVar12 = vpord_avx512f(auVar15,auVar12);
  auVar14 = vpsrlvd_avx512f(auVar14,_DAT_001a0680);
  auVar15._0_4_ = auVar14._0_4_;
  auVar15._4_4_ = auVar12._4_4_;
  auVar15._8_4_ = auVar12._8_4_;
  auVar15._12_4_ = auVar14._12_4_;
  auVar15._16_4_ = auVar12._16_4_;
  auVar15._20_4_ = auVar12._20_4_;
  auVar15._24_4_ = auVar14._24_4_;
  auVar15._28_4_ = auVar12._28_4_;
  auVar15._32_4_ = auVar12._32_4_;
  auVar15._36_4_ = auVar14._36_4_;
  auVar15._40_4_ = auVar12._40_4_;
  auVar15._44_4_ = auVar12._44_4_;
  auVar15._48_4_ = auVar14._48_4_;
  auVar15._52_4_ = auVar12._52_4_;
  auVar15._60_4_ = auVar14._60_4_;
  auVar15._56_4_ = auVar12._56_4_;
  auVar12 = vpord_avx512f(auVar13,auVar15);
  auVar12 = vmovdqu64_avx512f(auVar12);
  *(undefined1 (*) [64])(out + 3) = auVar12;
  return out + 0x13;
}

Assistant:

uint32_t *__fastpackwithoutmask19_32(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 19;
  ++out;
  *out = ((*in)) >> (19 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 25;
  ++out;
  *out = ((*in)) >> (19 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (19 - 18);
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  *out = ((*in)) >> (19 - 5);
  ++in;
  *out |= ((*in)) << 5;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (19 - 11);
  ++in;
  *out |= ((*in)) << 11;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (19 - 17);
  ++in;
  *out |= ((*in)) << 17;
  ++out;
  *out = ((*in)) >> (19 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 23;
  ++out;
  *out = ((*in)) >> (19 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 29;
  ++out;
  *out = ((*in)) >> (19 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (19 - 3);
  ++in;
  *out |= ((*in)) << 3;
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (19 - 9);
  ++in;
  *out |= ((*in)) << 9;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (19 - 15);
  ++in;
  *out |= ((*in)) << 15;
  ++out;
  *out = ((*in)) >> (19 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 21;
  ++out;
  *out = ((*in)) >> (19 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 27;
  ++out;
  *out = ((*in)) >> (19 - 14);
  ++in;
  *out |= ((*in)) << 14;
  ++out;
  *out = ((*in)) >> (19 - 1);
  ++in;
  *out |= ((*in)) << 1;
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (19 - 7);
  ++in;
  *out |= ((*in)) << 7;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (19 - 13);
  ++in;
  *out |= ((*in)) << 13;
  ++out;
  ++in;

  return out;
}